

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodings.h
# Opt level: O3

bool rapidjson::UTF8<char>::
     Validate<rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>::PercentEncodeStream<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,rapidjson::CrtAllocator>>>
               (GenericStringStream<rapidjson::UTF8<char>_> *is,
               PercentEncodeStream<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>_>
               *os)

{
  byte c;
  byte *pbVar1;
  char *pcVar2;
  char cVar3;
  
  pbVar1 = (byte *)is->src_;
  is->src_ = (Ch *)(pbVar1 + 1);
  c = *pbVar1;
  GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  ::
  PercentEncodeStream<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>_>
  ::Put(os,c);
  if (-1 < (char)c) {
    return true;
  }
  switch(GetRange(unsigned_char)::type[c]) {
  case 2:
    pcVar2 = is->src_;
    is->src_ = pcVar2 + 1;
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::
    PercentEncodeStream<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>_>
    ::Put(os,*pcVar2);
    return false;
  case 3:
    pcVar2 = is->src_;
    is->src_ = pcVar2 + 1;
    cVar3 = *pcVar2;
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::
    PercentEncodeStream<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>_>
    ::Put(os,cVar3);
    goto LAB_00142307;
  case 4:
    pcVar2 = is->src_;
    is->src_ = pcVar2 + 1;
    cVar3 = *pcVar2;
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::
    PercentEncodeStream<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>_>
    ::Put(os,cVar3);
LAB_00142307:
    if (cVar3 == '\0') {
      return false;
    }
    pcVar2 = is->src_;
    is->src_ = pcVar2 + 1;
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::
    PercentEncodeStream<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>_>
    ::Put(os,*pcVar2);
    return false;
  case 5:
    pcVar2 = is->src_;
    is->src_ = pcVar2 + 1;
    cVar3 = *pcVar2;
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::
    PercentEncodeStream<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>_>
    ::Put(os,cVar3);
    if (cVar3 == '\0') {
      return false;
    }
    pcVar2 = is->src_;
    is->src_ = pcVar2 + 1;
    cVar3 = *pcVar2;
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::
    PercentEncodeStream<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>_>
    ::Put(os,cVar3);
    break;
  case 6:
    pcVar2 = is->src_;
    is->src_ = pcVar2 + 1;
    cVar3 = *pcVar2;
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::
    PercentEncodeStream<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>_>
    ::Put(os,cVar3);
    if (cVar3 == '\0') {
      return false;
    }
    pcVar2 = is->src_;
    is->src_ = pcVar2 + 1;
    cVar3 = *pcVar2;
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::
    PercentEncodeStream<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>_>
    ::Put(os,cVar3);
    break;
  default:
    goto switchD_001421fc_caseD_7;
  case 10:
    pcVar2 = is->src_;
    is->src_ = pcVar2 + 1;
    cVar3 = *pcVar2;
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::
    PercentEncodeStream<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>_>
    ::Put(os,cVar3);
    if (cVar3 == '\0') {
      return false;
    }
    pcVar2 = is->src_;
    is->src_ = pcVar2 + 1;
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::
    PercentEncodeStream<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>_>
    ::Put(os,*pcVar2);
    return false;
  case 0xb:
    pcVar2 = is->src_;
    is->src_ = pcVar2 + 1;
    cVar3 = *pcVar2;
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::
    PercentEncodeStream<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>_>
    ::Put(os,cVar3);
    if (cVar3 == '\0') {
      return false;
    }
    pcVar2 = is->src_;
    is->src_ = pcVar2 + 1;
    cVar3 = *pcVar2;
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::
    PercentEncodeStream<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>_>
    ::Put(os,cVar3);
  }
  if (cVar3 != '\0') {
    pcVar2 = is->src_;
    is->src_ = pcVar2 + 1;
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::
    PercentEncodeStream<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>_>
    ::Put(os,*pcVar2);
  }
switchD_001421fc_caseD_7:
  return false;
}

Assistant:

static bool Validate(InputStream& is, OutputStream& os) {
#define RAPIDJSON_COPY() if (c != '\0') os.Put(c = is.Take())
#define RAPIDJSON_TRANS(mask) result &= ((GetRange(static_cast<unsigned char>(c)) & mask) != 0)
#define RAPIDJSON_TAIL() RAPIDJSON_COPY(); RAPIDJSON_TRANS(0x70)
        Ch c = static_cast<Ch>(-1);
        RAPIDJSON_COPY();
        if (!(c & 0x80))
            return true;

        bool result = true;
        switch (GetRange(static_cast<unsigned char>(c))) {
        case 2: RAPIDJSON_TAIL(); return result;
        case 3: RAPIDJSON_TAIL(); RAPIDJSON_TAIL(); return result;
        case 4: RAPIDJSON_COPY(); RAPIDJSON_TRANS(0x50); RAPIDJSON_TAIL(); return result;
        case 5: RAPIDJSON_COPY(); RAPIDJSON_TRANS(0x10); RAPIDJSON_TAIL(); RAPIDJSON_TAIL(); return result;
        case 6: RAPIDJSON_TAIL(); RAPIDJSON_TAIL(); RAPIDJSON_TAIL(); return result;
        case 10: RAPIDJSON_COPY(); RAPIDJSON_TRANS(0x20); RAPIDJSON_TAIL(); return result;
        case 11: RAPIDJSON_COPY(); RAPIDJSON_TRANS(0x60); RAPIDJSON_TAIL(); RAPIDJSON_TAIL(); return result;
        default: return false;
        }
#undef RAPIDJSON_COPY
#undef RAPIDJSON_TRANS
#undef RAPIDJSON_TAIL
    }